

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Data<QHashPrivate::Node<QAbstractButton_*,_int>_> *
QHashPrivate::Data<QHashPrivate::Node<QAbstractButton_*,_int>_>::detached
          (Data<QHashPrivate::Node<QAbstractButton_*,_int>_> *d)

{
  Data<QHashPrivate::Node<QAbstractButton_*,_int>_> *this;
  undefined8 *puVar1;
  size_t sVar2;
  
  this = (Data<QHashPrivate::Node<QAbstractButton_*,_int>_> *)operator_new(0x28);
  if (d == (Data<QHashPrivate::Node<QAbstractButton_*,_int>_> *)0x0) {
    (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
    this->size = 0;
    this->numBuckets = 0x80;
    puVar1 = (undefined8 *)operator_new__(0x98);
    *puVar1 = 1;
    puVar1[0x11] = 0;
    *(undefined2 *)(puVar1 + 0x12) = 0;
    *(undefined4 *)(puVar1 + 1) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0xc) = 0xffffffff;
    *(undefined4 *)(puVar1 + 2) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x14) = 0xffffffff;
    *(undefined4 *)(puVar1 + 3) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x1c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 4) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x24) = 0xffffffff;
    *(undefined4 *)(puVar1 + 5) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x2c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 6) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x34) = 0xffffffff;
    *(undefined4 *)(puVar1 + 7) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x3c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 8) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x44) = 0xffffffff;
    *(undefined4 *)(puVar1 + 9) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x4c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 10) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x54) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0xb) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x5c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0xc) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 100) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0xd) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x6c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0xe) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x74) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0xf) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x7c) = 0xffffffff;
    *(undefined4 *)(puVar1 + 0x10) = 0xffffffff;
    *(undefined4 *)((long)puVar1 + 0x84) = 0xffffffff;
    this->spans = (Span *)(puVar1 + 1);
    sVar2 = QHashSeed::globalSeed();
    this->seed = sVar2;
  }
  else {
    Data(this,d);
    if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (d->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (d->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        ~Data(d);
        operator_delete(d,0x28);
      }
    }
  }
  return this;
}

Assistant:

static Data *detached(Data *d)
    {
        if (!d)
            return new Data;
        Data *dd = new Data(*d);
        if (!d->ref.deref())
            delete d;
        return dd;
    }